

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O2

wstring * PDA::Transducer::Generator::comment(wstring *__return_storage_ptr__,wstring *source)

{
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_50;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_30;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = L'\0';
  std::operator+(&local_50,L"\t#***\t",source);
  std::operator+(&local_30,&local_50,L"\t***#");
  std::__cxx11::wstring::operator=((wstring *)__return_storage_ptr__,(wstring *)&local_30);
  std::__cxx11::wstring::~wstring((wstring *)&local_30);
  std::__cxx11::wstring::~wstring((wstring *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

std::wstring Generator::comment(const std::wstring &source)
{
    std::wstring result;
    result = L"\t#***\t" + source + L"\t***#";
    return result;
}